

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# source.cpp
# Opt level: O3

bool __thiscall
anon_unknown.dwarf_54919::SetSourcefv
          (anon_unknown_dwarf_54919 *this,ALsource *Source,ALCcontext *Context,SourceProp prop,
          span<const_float,_18446744073709551615UL> values)

{
  float fVar1;
  Voice *oldvoice;
  bool bVar2;
  undefined4 in_register_0000000c;
  float *pfVar3;
  ALCcontext *Context_00;
  int OffsetType;
  char *pcVar4;
  ALenum errorCode;
  pointer pfVar5;
  undefined8 uVar6;
  pointer piVar7;
  span<const_int,_18446744073709551615UL> values_00;
  int ival;
  int local_60;
  int local_5c;
  VoicePos local_58;
  optional<(anonymous_namespace)::VoicePos> local_48;
  
  pfVar3 = (float *)CONCAT44(in_register_0000000c,prop);
  pfVar5 = values.mData;
  OffsetType = (int)Context;
  Context_00 = (ALCcontext *)((ulong)Context & 0xffffffff);
  if (0x1200 < OffsetType) {
    if (OffsetType < 0xc000) {
      if (OffsetType < 0x1212) {
        if ((OffsetType == 0x1201) || (OffsetType == 0x1203)) {
          pcVar4 = "Setting read-only source property 0x%04x";
          errorCode = 0xa004;
          goto LAB_001227f5;
        }
      }
      else if ((OffsetType == 0x1212) || (OffsetType == 0x1214)) goto switchD_00122592_caseD_1007;
      goto switchD_00122592_caseD_1008;
    }
    switch(OffsetType) {
    case 0x20007:
      piVar7 = (pointer)((long)pfVar5 - (long)pfVar3 >> 2);
      if ((piVar7 != (pointer)0x1) && (piVar7 != (pointer)0x6)) {
        Context_00 = (ALCcontext *)0x20007;
        goto LAB_00122e81;
      }
      fVar1 = *pfVar3;
      if ((0.0 <= fVar1) && (fVar1 <= 10.0)) {
        *(float *)(this + 0x7c) = fVar1;
        goto LAB_00122df9;
      }
      break;
    case 0x20008:
      piVar7 = (pointer)((long)pfVar5 - (long)pfVar3 >> 2);
      if ((piVar7 != (pointer)0x1) && (piVar7 != (pointer)0x6)) {
        Context_00 = (ALCcontext *)0x20008;
        goto LAB_00122e81;
      }
      fVar1 = *pfVar3;
      if ((0.0 <= fVar1) && (fVar1 <= 10.0)) {
        *(float *)(this + 0x80) = fVar1;
        goto LAB_00122df9;
      }
      break;
    case 0x20009:
      piVar7 = (pointer)((long)pfVar5 - (long)pfVar3 >> 2);
      if ((piVar7 != (pointer)0x1) && (piVar7 != (pointer)0x6)) {
        Context_00 = (ALCcontext *)0x20009;
        goto LAB_00122e81;
      }
      fVar1 = *pfVar3;
      if ((0.0 <= fVar1) && (fVar1 <= 1.0)) {
        *(float *)(this + 0x78) = fVar1;
        goto LAB_00122df9;
      }
      break;
    case 0x2000a:
    case 0x2000b:
    case 0x2000c:
      goto switchD_00122592_caseD_1007;
    default:
      if (OffsetType != 0xc000) {
        if (OffsetType != 0xd000) goto switchD_00122592_caseD_1008;
        goto switchD_00122592_caseD_1007;
      }
      piVar7 = (pointer)((long)pfVar5 - (long)pfVar3 >> 2);
      if ((piVar7 != (pointer)0x1) && (piVar7 != (pointer)0x6)) {
        Context_00 = (ALCcontext *)0xc000;
        goto LAB_00122e81;
      }
      fVar1 = *pfVar3;
      if ((0.0 <= fVar1) && (fVar1 <= 1.0)) {
        *(float *)(this + 0x84) = fVar1;
        goto LAB_00122df9;
      }
    }
    goto LAB_00122e64;
  }
  switch(OffsetType) {
  case 0x1001:
    piVar7 = (pointer)((long)pfVar5 - (long)pfVar3 >> 2);
    if ((piVar7 != (pointer)0x1) && (piVar7 != (pointer)0x6)) {
      Context_00 = (ALCcontext *)0x1001;
      goto LAB_00122e81;
    }
    fVar1 = *pfVar3;
    if ((0.0 <= fVar1) && (fVar1 <= 360.0)) {
      *(float *)(this + 0x14) = fVar1;
LAB_00122df9:
      UpdateSourceProps((ALsource *)this,(ALCcontext *)Source);
      return true;
    }
    break;
  case 0x1002:
    piVar7 = (pointer)((long)pfVar5 - (long)pfVar3 >> 2);
    if ((piVar7 != (pointer)0x1) && (piVar7 != (pointer)0x6)) {
      Context_00 = (ALCcontext *)0x1002;
      goto LAB_00122e81;
    }
    fVar1 = *pfVar3;
    if ((0.0 <= fVar1) && (fVar1 <= 360.0)) {
      *(float *)(this + 0x18) = fVar1;
      goto LAB_00122df9;
    }
    break;
  case 0x1003:
    piVar7 = (pointer)((long)pfVar5 - (long)pfVar3 >> 2);
    if ((piVar7 != (pointer)0x1) && (piVar7 != (pointer)0x6)) {
      Context_00 = (ALCcontext *)0x1003;
      goto LAB_00122e81;
    }
    if (0.0 <= *pfVar3) {
      *(float *)this = *pfVar3;
      goto LAB_00122df9;
    }
    break;
  case 0x1004:
    piVar7 = (pointer)((long)pfVar5 - (long)pfVar3 >> 2);
    if ((piVar7 != (pointer)0x3) && (piVar7 != (pointer)0x6)) {
      Context_00 = (ALCcontext *)0x1004;
LAB_00122f55:
      uVar6 = 3;
      goto LAB_00122e38;
    }
    if ((((uint)ABS(*pfVar3) < 0x7f800000) && ((uint)ABS(pfVar3[1]) < 0x7f800000)) &&
       ((uint)ABS(pfVar3[2]) < 0x7f800000)) {
      *(float *)(this + 0x28) = *pfVar3;
      *(float *)(this + 0x2c) = pfVar3[1];
      *(float *)(this + 0x30) = pfVar3[2];
      goto LAB_00122df9;
    }
    break;
  case 0x1005:
    piVar7 = (pointer)((long)pfVar5 - (long)pfVar3 >> 2);
    if ((piVar7 != (pointer)0x3) && (piVar7 != (pointer)0x6)) {
      Context_00 = (ALCcontext *)0x1005;
      goto LAB_00122f55;
    }
    if ((((uint)ABS(*pfVar3) < 0x7f800000) && ((uint)ABS(pfVar3[1]) < 0x7f800000)) &&
       ((uint)ABS(pfVar3[2]) < 0x7f800000)) {
      *(float *)(this + 0x40) = *pfVar3;
      *(float *)(this + 0x44) = pfVar3[1];
      *(float *)(this + 0x48) = pfVar3[2];
      goto LAB_00122df9;
    }
    break;
  case 0x1006:
    piVar7 = (pointer)((long)pfVar5 - (long)pfVar3 >> 2);
    if ((piVar7 != (pointer)0x3) && (piVar7 != (pointer)0x6)) {
      Context_00 = (ALCcontext *)0x1006;
      goto LAB_00122f55;
    }
    if ((((uint)ABS(*pfVar3) < 0x7f800000) && ((uint)ABS(pfVar3[1]) < 0x7f800000)) &&
       ((uint)ABS(pfVar3[2]) < 0x7f800000)) {
      *(float *)(this + 0x34) = *pfVar3;
      *(float *)(this + 0x38) = pfVar3[1];
      *(float *)(this + 0x3c) = pfVar3[2];
      goto LAB_00122df9;
    }
    break;
  case 0x1008:
  case 0x1009:
  case 0x100b:
  case 0x100c:
  case 0x1011:
  case 0x1012:
  case 0x1013:
  case 0x1014:
  case 0x1017:
  case 0x1018:
  case 0x1019:
  case 0x101a:
  case 0x101b:
  case 0x101c:
  case 0x101d:
  case 0x101e:
  case 0x101f:
  case 0x1028:
  case 0x1029:
  case 0x102a:
  case 0x102b:
  case 0x102c:
  case 0x102d:
  case 0x102e:
  case 0x102f:
  case 0x1032:
switchD_00122592_caseD_1008:
    if (0 < (int)gLogLevel) {
      fprintf((FILE *)gLogFile,"[ALSOFT] (EE) Unexpected property: 0x%04x\n",Context_00);
    }
    pcVar4 = "Invalid source float property 0x%04x";
    errorCode = 0xa002;
LAB_001227f5:
    ALCcontext::setError((ALCcontext *)Source,errorCode,pcVar4,Context_00);
    return false;
  case 0x100a:
    piVar7 = (pointer)((long)pfVar5 - (long)pfVar3 >> 2);
    if ((piVar7 != (pointer)0x1) && (piVar7 != (pointer)0x6)) {
      Context_00 = (ALCcontext *)0x100a;
      goto LAB_00122e81;
    }
    if (0.0 <= *pfVar3) {
      *(float *)(this + 4) = *pfVar3;
      goto LAB_00122df9;
    }
    break;
  case 0x100d:
    piVar7 = (pointer)((long)pfVar5 - (long)pfVar3 >> 2);
    if ((piVar7 != (pointer)0x1) && (piVar7 != (pointer)0x6)) {
      Context_00 = (ALCcontext *)0x100d;
      goto LAB_00122e81;
    }
    if (0.0 <= *pfVar3) {
      *(float *)(this + 0xc) = *pfVar3;
      goto LAB_00122df9;
    }
    break;
  case 0x100e:
    piVar7 = (pointer)((long)pfVar5 - (long)pfVar3 >> 2);
    if ((piVar7 != (pointer)0x1) && (piVar7 != (pointer)0x6)) {
      Context_00 = (ALCcontext *)0x100e;
      goto LAB_00122e81;
    }
    if (0.0 <= *pfVar3) {
      *(float *)(this + 0x10) = *pfVar3;
      goto LAB_00122df9;
    }
    break;
  case 0x100f:
    if ((long)pfVar5 - (long)pfVar3 != 0x18) {
      piVar7 = (pointer)((long)pfVar5 - (long)pfVar3 >> 2);
      Context_00 = (ALCcontext *)0x100f;
      uVar6 = 6;
      goto LAB_00122e38;
    }
    if ((((((uint)ABS(*pfVar3) < 0x7f800000) && ((uint)ABS(pfVar3[1]) < 0x7f800000)) &&
         ((uint)ABS(pfVar3[2]) < 0x7f800000)) &&
        (((uint)ABS(pfVar3[3]) < 0x7f800000 && ((uint)ABS(pfVar3[4]) < 0x7f800000)))) &&
       ((uint)ABS(pfVar3[5]) < 0x7f800000)) {
      *(float *)(this + 0x4c) = *pfVar3;
      *(float *)(this + 0x50) = pfVar3[1];
      *(float *)(this + 0x54) = pfVar3[2];
      *(float *)(this + 0x58) = pfVar3[3];
      *(float *)(this + 0x5c) = pfVar3[4];
      *(float *)(this + 0x60) = pfVar3[5];
      goto LAB_00122df9;
    }
    break;
  case 0x1015:
  case 0x1016:
    piVar7 = (pointer)((long)pfVar5 - (long)pfVar3 >> 2);
    if ((piVar7 == (pointer)0x1) || (piVar7 == (pointer)0x6)) {
      local_60 = (int)(long)*pfVar3;
      goto LAB_00122742;
    }
    goto LAB_00122e81;
  case 0x1020:
    piVar7 = (pointer)((long)pfVar5 - (long)pfVar3 >> 2);
    if ((piVar7 != (pointer)0x1) && (piVar7 != (pointer)0x6)) {
      Context_00 = (ALCcontext *)0x1020;
      goto LAB_00122e81;
    }
    if (0.0 <= *pfVar3) {
      *(float *)(this + 0x1c) = *pfVar3;
      goto LAB_00122df9;
    }
    break;
  case 0x1021:
    piVar7 = (pointer)((long)pfVar5 - (long)pfVar3 >> 2);
    if ((piVar7 != (pointer)0x1) && (piVar7 != (pointer)0x6)) {
      Context_00 = (ALCcontext *)0x1021;
      goto LAB_00122e81;
    }
    if (0.0 <= *pfVar3) {
      *(float *)(this + 0x24) = *pfVar3;
      goto LAB_00122df9;
    }
    break;
  case 0x1022:
    piVar7 = (pointer)((long)pfVar5 - (long)pfVar3 >> 2);
    if ((piVar7 != (pointer)0x1) && (piVar7 != (pointer)0x6)) {
      Context_00 = (ALCcontext *)0x1022;
      goto LAB_00122e81;
    }
    fVar1 = *pfVar3;
    if ((0.0 <= fVar1) && (fVar1 <= 1.0)) {
      *(float *)(this + 8) = fVar1;
      goto LAB_00122df9;
    }
    break;
  case 0x1023:
    piVar7 = (pointer)((long)pfVar5 - (long)pfVar3 >> 2);
    if ((piVar7 != (pointer)0x1) && (piVar7 != (pointer)0x6)) {
      Context_00 = (ALCcontext *)0x1023;
      goto LAB_00122e81;
    }
    if (0.0 <= *pfVar3) {
      *(float *)(this + 0x20) = *pfVar3;
      goto LAB_00122df9;
    }
    break;
  case 0x1024:
  case 0x1025:
  case 0x1026:
    piVar7 = (pointer)((long)pfVar5 - (long)pfVar3 >> 2);
    if ((piVar7 != (pointer)0x1) && (piVar7 != (pointer)0x6)) goto LAB_00122e81;
    if (0.0 <= *pfVar3) {
      if ((*(ulong *)&(Source->Send)._M_elems[5].LFReference <= (ulong)*(uint *)(this + 0x18c)) ||
         (oldvoice = *(Voice **)
                      (*(long *)&(Source->Send)._M_elems[5].HFReference + 8 +
                      (ulong)*(uint *)(this + 0x18c) * 8),
         (oldvoice->mSourceID).super___atomic_base<unsigned_int>._M_i != *(__int_type *)(this + 400)
         )) {
        *(undefined4 *)(this + 0x18c) = 0xffffffff;
LAB_00122767:
        *(int *)(this + 0x170) = OffsetType;
        *(double *)(this + 0x168) = (double)*pfVar3;
        return true;
      }
      if ((oldvoice->mFlags & 2) == 0) {
        GetSampleOffset(&local_48,*(BufferlistItem **)(this + 0x180),OffsetType,(double)*pfVar3);
        if (local_48.mHasValue != false) {
          local_58.pos = local_48.field_1.mValue.pos;
          local_58.frac = local_48.field_1.mValue.frac;
          local_58.bufferitem = local_48.field_1.mValue.bufferitem;
          local_60 = CONCAT31(local_60._1_3_,1);
          bVar2 = SetVoiceOffset(oldvoice,&local_58,(ALsource *)this,(ALCcontext *)Source,
                                 *(ALCdevice **)&Source[1].mDistanceModel);
          if (bVar2) {
            return true;
          }
          goto LAB_00122767;
        }
        pcVar4 = "Invalid offset";
      }
      else {
        pcVar4 = "Source offset for callback is invalid";
      }
      goto LAB_00122e51;
    }
    break;
  case 0x1030:
    piVar7 = (pointer)((long)pfVar5 - (long)pfVar3 >> 2);
    if (((ulong)piVar7 | 4) != 6) {
      Context_00 = (ALCcontext *)0x1030;
      uVar6 = 2;
      goto LAB_00122e38;
    }
    if (((uint)ABS(*pfVar3) < 0x7f800000) && ((uint)ABS(pfVar3[1]) < 0x7f800000)) {
      *(float *)(this + 0x88) = *pfVar3;
      *(float *)(this + 0x8c) = pfVar3[1];
      goto LAB_00122df9;
    }
    break;
  case 0x1031:
    piVar7 = (pointer)((long)pfVar5 - (long)pfVar3 >> 2);
    if ((piVar7 != (pointer)0x1) && (piVar7 != (pointer)0x6)) {
      Context_00 = (ALCcontext *)0x1031;
      goto LAB_00122e81;
    }
    fVar1 = *pfVar3;
    if ((int)ABS(fVar1) - 0x800000U < 0x7f000000 && -1 < (int)fVar1 ||
        (ABS(fVar1) == 0.0 || (int)fVar1 - 1U < 0x7fffff)) {
      *(float *)(this + 0x90) = fVar1;
      goto LAB_00122df9;
    }
    break;
  default:
    if (OffsetType != 0x202) goto switchD_00122592_caseD_1008;
  case 0x1007:
  case 0x1010:
  case 0x1027:
  case 0x1033:
switchD_00122592_caseD_1007:
    piVar7 = (pointer)((long)pfVar5 - (long)pfVar3 >> 2);
    if ((piVar7 == (pointer)0x1) || (piVar7 == (pointer)0x6)) {
      local_60 = (int)*pfVar3;
LAB_00122742:
      values_00.mData = &local_5c;
      values_00.mDataEnd = piVar7;
      bVar2 = SetSourceiv(this,Source,Context_00,(SourceProp)&local_60,values_00);
      return bVar2;
    }
LAB_00122e81:
    uVar6 = 1;
LAB_00122e38:
    ALCcontext::setError
              ((ALCcontext *)Source,0xa002,"Property 0x%04x expects %d value(s), got %zu",Context_00
               ,uVar6,piVar7);
    return false;
  }
LAB_00122e64:
  pcVar4 = "Value out of range";
LAB_00122e51:
  ALCcontext::setError((ALCcontext *)Source,0xa003,pcVar4);
  return false;
}

Assistant:

bool SetSourcefv(ALsource *Source, ALCcontext *Context, SourceProp prop, const al::span<const float> values)
{
    int ival;

    switch(prop)
    {
    case AL_SEC_OFFSET_LATENCY_SOFT:
    case AL_SEC_OFFSET_CLOCK_SOFT:
        /* Query only */
        SETERR_RETURN(Context, AL_INVALID_OPERATION, false,
            "Setting read-only source property 0x%04x", prop);

    case AL_PITCH:
        CHECKSIZE(values, 1);
        CHECKVAL(values[0] >= 0.0f);

        Source->Pitch = values[0];
        return UpdateSourceProps(Source, Context);

    case AL_CONE_INNER_ANGLE:
        CHECKSIZE(values, 1);
        CHECKVAL(values[0] >= 0.0f && values[0] <= 360.0f);

        Source->InnerAngle = values[0];
        return UpdateSourceProps(Source, Context);

    case AL_CONE_OUTER_ANGLE:
        CHECKSIZE(values, 1);
        CHECKVAL(values[0] >= 0.0f && values[0] <= 360.0f);

        Source->OuterAngle = values[0];
        return UpdateSourceProps(Source, Context);

    case AL_GAIN:
        CHECKSIZE(values, 1);
        CHECKVAL(values[0] >= 0.0f);

        Source->Gain = values[0];
        return UpdateSourceProps(Source, Context);

    case AL_MAX_DISTANCE:
        CHECKSIZE(values, 1);
        CHECKVAL(values[0] >= 0.0f);

        Source->MaxDistance = values[0];
        return UpdateSourceProps(Source, Context);

    case AL_ROLLOFF_FACTOR:
        CHECKSIZE(values, 1);
        CHECKVAL(values[0] >= 0.0f);

        Source->RolloffFactor = values[0];
        return UpdateSourceProps(Source, Context);

    case AL_REFERENCE_DISTANCE:
        CHECKSIZE(values, 1);
        CHECKVAL(values[0] >= 0.0f);

        Source->RefDistance = values[0];
        return UpdateSourceProps(Source, Context);

    case AL_MIN_GAIN:
        CHECKSIZE(values, 1);
        CHECKVAL(values[0] >= 0.0f);

        Source->MinGain = values[0];
        return UpdateSourceProps(Source, Context);

    case AL_MAX_GAIN:
        CHECKSIZE(values, 1);
        CHECKVAL(values[0] >= 0.0f);

        Source->MaxGain = values[0];
        return UpdateSourceProps(Source, Context);

    case AL_CONE_OUTER_GAIN:
        CHECKSIZE(values, 1);
        CHECKVAL(values[0] >= 0.0f && values[0] <= 1.0f);

        Source->OuterGain = values[0];
        return UpdateSourceProps(Source, Context);

    case AL_CONE_OUTER_GAINHF:
        CHECKSIZE(values, 1);
        CHECKVAL(values[0] >= 0.0f && values[0] <= 1.0f);

        Source->OuterGainHF = values[0];
        return UpdateSourceProps(Source, Context);

    case AL_AIR_ABSORPTION_FACTOR:
        CHECKSIZE(values, 1);
        CHECKVAL(values[0] >= 0.0f && values[0] <= 10.0f);

        Source->AirAbsorptionFactor = values[0];
        return UpdateSourceProps(Source, Context);

    case AL_ROOM_ROLLOFF_FACTOR:
        CHECKSIZE(values, 1);
        CHECKVAL(values[0] >= 0.0f && values[0] <= 10.0f);

        Source->RoomRolloffFactor = values[0];
        return UpdateSourceProps(Source, Context);

    case AL_DOPPLER_FACTOR:
        CHECKSIZE(values, 1);
        CHECKVAL(values[0] >= 0.0f && values[0] <= 1.0f);

        Source->DopplerFactor = values[0];
        return UpdateSourceProps(Source, Context);

    case AL_SEC_OFFSET:
    case AL_SAMPLE_OFFSET:
    case AL_BYTE_OFFSET:
        CHECKSIZE(values, 1);
        CHECKVAL(values[0] >= 0.0f);

        if(Voice *voice{GetSourceVoice(Source, Context)})
        {
            if((voice->mFlags&VoiceIsCallback))
                SETERR_RETURN(Context, AL_INVALID_VALUE, false,
                    "Source offset for callback is invalid");
            auto vpos = GetSampleOffset(Source->queue, prop, values[0]);
            if(!vpos) SETERR_RETURN(Context, AL_INVALID_VALUE, false, "Invalid offset");

            if(SetVoiceOffset(voice, *vpos, Source, Context, Context->mDevice.get()))
                return true;
        }
        Source->OffsetType = prop;
        Source->Offset = values[0];
        return true;

    case AL_SOURCE_RADIUS:
        CHECKSIZE(values, 1);
        CHECKVAL(values[0] >= 0.0f && std::isfinite(values[0]));

        Source->Radius = values[0];
        return UpdateSourceProps(Source, Context);

    case AL_STEREO_ANGLES:
        CHECKSIZE(values, 2);
        CHECKVAL(std::isfinite(values[0]) && std::isfinite(values[1]));

        Source->StereoPan[0] = values[0];
        Source->StereoPan[1] = values[1];
        return UpdateSourceProps(Source, Context);


    case AL_POSITION:
        CHECKSIZE(values, 3);
        CHECKVAL(std::isfinite(values[0]) && std::isfinite(values[1]) && std::isfinite(values[2]));

        Source->Position[0] = values[0];
        Source->Position[1] = values[1];
        Source->Position[2] = values[2];
        return UpdateSourceProps(Source, Context);

    case AL_VELOCITY:
        CHECKSIZE(values, 3);
        CHECKVAL(std::isfinite(values[0]) && std::isfinite(values[1]) && std::isfinite(values[2]));

        Source->Velocity[0] = values[0];
        Source->Velocity[1] = values[1];
        Source->Velocity[2] = values[2];
        return UpdateSourceProps(Source, Context);

    case AL_DIRECTION:
        CHECKSIZE(values, 3);
        CHECKVAL(std::isfinite(values[0]) && std::isfinite(values[1]) && std::isfinite(values[2]));

        Source->Direction[0] = values[0];
        Source->Direction[1] = values[1];
        Source->Direction[2] = values[2];
        return UpdateSourceProps(Source, Context);

    case AL_ORIENTATION:
        CHECKSIZE(values, 6);
        CHECKVAL(std::isfinite(values[0]) && std::isfinite(values[1]) && std::isfinite(values[2])
            && std::isfinite(values[3]) && std::isfinite(values[4]) && std::isfinite(values[5]));

        Source->OrientAt[0] = values[0];
        Source->OrientAt[1] = values[1];
        Source->OrientAt[2] = values[2];
        Source->OrientUp[0] = values[3];
        Source->OrientUp[1] = values[4];
        Source->OrientUp[2] = values[5];
        return UpdateSourceProps(Source, Context);


    case AL_SOURCE_RELATIVE:
    case AL_LOOPING:
    case AL_SOURCE_STATE:
    case AL_SOURCE_TYPE:
    case AL_DISTANCE_MODEL:
    case AL_DIRECT_FILTER_GAINHF_AUTO:
    case AL_AUXILIARY_SEND_FILTER_GAIN_AUTO:
    case AL_AUXILIARY_SEND_FILTER_GAINHF_AUTO:
    case AL_DIRECT_CHANNELS_SOFT:
    case AL_SOURCE_RESAMPLER_SOFT:
    case AL_SOURCE_SPATIALIZE_SOFT:
        CHECKSIZE(values, 1);
        ival = static_cast<int>(values[0]);
        return SetSourceiv(Source, Context, prop, {&ival, 1u});

    case AL_BUFFERS_QUEUED:
    case AL_BUFFERS_PROCESSED:
        CHECKSIZE(values, 1);
        ival = static_cast<int>(static_cast<ALuint>(values[0]));
        return SetSourceiv(Source, Context, prop, {&ival, 1u});

    case AL_BUFFER:
    case AL_DIRECT_FILTER:
    case AL_AUXILIARY_SEND_FILTER:
    case AL_SAMPLE_OFFSET_LATENCY_SOFT:
    case AL_SAMPLE_OFFSET_CLOCK_SOFT:
        break;
    }

    ERR("Unexpected property: 0x%04x\n", prop);
    Context->setError(AL_INVALID_ENUM, "Invalid source float property 0x%04x", prop);
    return false;
}